

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

void __thiscall ncnn::Layer::Layer(Layer *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Layer_01d11570;
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 10));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x176fd6);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x176fe7);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x176ff8);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x177009);
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x11) = 0;
  *(undefined4 *)(in_RDI + 5) = 0xffffffff;
  in_RDI[4] = 0;
  return;
}

Assistant:

Layer::Layer()
{
    one_blob_only = false;
    support_inplace = false;
    support_vulkan = false;
    support_packing = false;

    support_bf16_storage = false;
    support_fp16_storage = false;
    support_int8_storage = false;
    support_image_storage = false;
    support_tensor_storage = false;

    support_reserved_00 = false;

    typeindex = -1;

#if NCNN_VULKAN
    vkdev = 0;
#endif // NCNN_VULKAN

    userdata = 0;
}